

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementNoiseCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *R)

{
  long lVar1;
  MatrixDynSize *in_RSI;
  long in_RDI;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  if ((lVar1 == *(long *)(in_RDI + 8)) &&
     (lVar1 = iDynTree::MatrixDynSize::cols(), lVar1 == *(long *)(in_RDI + 8))) {
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x1b0),in_RSI);
    *(undefined1 *)(in_RDI + 0x1dc) = 1;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetMeasurementNoiseCovariance",
             "Could not set KF measurement noise covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementNoiseCovariance(const iDynTree::MatrixDynSize& R)
{
    if ( (R.rows() != m_dim_Y) || (R.cols() != m_dim_Y))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetMeasurementNoiseCovariance", "Could not set KF measurement noise covariance - dimension mismatch");
        return false;
    }

    m_R = R;
    m_measurement_noise_covariance_matrix_set = true;
    return true;
}